

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void helics::arrayPairProcess
               (value *doc,string *key,
               function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
               *pairOp)

{
  pointer pbVar1;
  pointer pcVar2;
  size_type sVar3;
  _Hash_node_base _Var4;
  _Hash_node_base *p_Var5;
  bool bVar6;
  value_type *this;
  array_type *paVar7;
  string_type *psVar8;
  table_type *ptVar9;
  basic_value<toml::type_config> *val;
  pointer this_00;
  __node_base *p_Var10;
  basic_string_view<char,_std::char_traits<char>_> __args;
  basic_string_view<char,_std::char_traits<char>_> __args_00;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  basic_string_view<char,_std::char_traits<char>_> __args_1_00;
  
  bVar6 = fileops::isMember(doc,key);
  if (bVar6) {
    this = toml::basic_value<toml::type_config>::at(doc,key);
    if (this->type_ == array) {
      paVar7 = toml::basic_value<toml::type_config>::as_array(this);
      pbVar1 = (paVar7->
               super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (this_00 = (paVar7->
                     super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                     )._M_impl.super__Vector_impl_data._M_start; this_00 != pbVar1;
          this_00 = this_00 + 1) {
        paVar7 = toml::basic_value<toml::type_config>::as_array(this_00);
        psVar8 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar7->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start);
        pcVar2 = (psVar8->_M_dataplus)._M_p;
        sVar3 = psVar8->_M_string_length;
        paVar7 = toml::basic_value<toml::type_config>::as_array(this_00);
        psVar8 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((paVar7->
                            super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1);
        __args._M_str = pcVar2;
        __args._M_len = sVar3;
        __args_1._M_str = (psVar8->_M_dataplus)._M_p;
        __args_1._M_len = psVar8->_M_string_length;
        std::
        function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()(pairOp,__args,__args_1);
      }
    }
    else {
      ptVar9 = toml::basic_value<toml::type_config>::as_table_abi_cxx11_(this);
      p_Var10 = &(ptVar9->_M_h)._M_before_begin;
      while (p_Var10 = p_Var10->_M_nxt, p_Var10 != (__node_base *)0x0) {
        _Var4._M_nxt = p_Var10[1]._M_nxt;
        p_Var5 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var10 + 2))->_M_max_load_factor;
        psVar8 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_
                           ((basic_value<toml::type_config> *)(p_Var10 + 5));
        __args_00._M_str = (char *)_Var4._M_nxt;
        __args_00._M_len = (size_t)p_Var5;
        __args_1_00._M_str = (psVar8->_M_dataplus)._M_p;
        __args_1_00._M_len = psVar8->_M_string_length;
        std::
        function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()(pairOp,__args_00,__args_1_00);
      }
    }
  }
  return;
}

Assistant:

static void arrayPairProcess(toml::value doc,
                             const std::string& key,
                             const std::function<void(std::string_view, std::string_view)>& pairOp)
{
    using fileops::isMember;
    if (isMember(doc, key)) {
        auto& info = toml::find(doc, key);
        if (info.is_array()) {
            for (auto& val : info.as_array()) {
                pairOp(static_cast<std::string_view>(val.as_array()[0].as_string()),
                       static_cast<std::string_view>(val.as_array()[1].as_string()));
            }
        } else {
            for (const auto& val : info.as_table()) {
                pairOp(val.first, static_cast<std::string_view>(val.second.as_string()));
            }
        }
    }
}